

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::CreateShader::exec(CreateShader *this,Thread *t)

{
  GLenum *t_00;
  ostream *poVar1;
  GLuint GVar2;
  deUint32 err;
  Thread *pTVar3;
  MessageBuilder *pMVar4;
  undefined1 local_1c0 [400];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 != (Thread *)0x0) {
    local_1c0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    std::operator<<((ostream *)(local_1c0 + 0x18),"Begin -- glCreateShader(");
    t_00 = &this->m_type;
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<((MessageBuilder *)local_1c0,t_00);
    std::operator<<((ostream *)&pMVar4->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    GVar2 = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x3f0))(*t_00);
    err = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"glCreateShader()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x552);
    local_1c0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c0 + 8));
    poVar1 = (ostream *)(local_1c0 + 0x18);
    std::operator<<(poVar1,"End -- ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," = glCreateShader(");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<((MessageBuilder *)local_1c0,t_00);
    std::operator<<((ostream *)&pMVar4->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
    ((this->m_shader).m_ptr)->shader = GVar2;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void CreateShader::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint shader = 0;

	thread.newMessage() << "Begin -- glCreateShader(" << m_type << ")" << tcu::ThreadUtil::Message::End;
	shader = thread.gl.createShader(m_type);
	GLU_CHECK_GLW_MSG(thread.gl, "glCreateShader()");
	thread.newMessage() << "End -- " << shader  << " = glCreateShader(" << m_type << ")" << tcu::ThreadUtil::Message::End;

	m_shader->shader	= shader;
}